

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::insert
          (SerialArenaChunk *this,void *me,SerialArena *serial)

{
  SerialArenaChunk *pSVar1;
  uint32_t i;
  uint uVar2;
  atomic<void_*> *paVar3;
  atomic<google::protobuf::internal::SerialArena_*> *paVar4;
  
  if (((ulong)this & 7) == 0) {
    LOCK();
    pSVar1 = this + 0xc;
    i = *(uint32_t *)pSVar1;
    *(uint32_t *)pSVar1 = *(uint32_t *)pSVar1 + 1;
    UNLOCK();
    uVar2 = *(uint *)(this + 8);
    if (i < uVar2) {
      paVar3 = id(this,i);
      (paVar3->_M_b)._M_p = me;
      paVar4 = arena(this,i);
      (paVar4->_M_b)._M_p = serial;
    }
    else {
      *(uint *)(this + 0xc) = uVar2;
    }
    return i < uVar2;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = char]"
               );
}

Assistant:

bool insert(void* me, SerialArena* serial) {
    uint32_t idx = size().fetch_add(1, std::memory_order_relaxed);
    // Bail out if this chunk is full.
    if (idx >= capacity()) {
      // Write old value back to avoid potential overflow.
      size().store(capacity(), std::memory_order_relaxed);
      return false;
    }

    id(idx).store(me, std::memory_order_relaxed);
    arena(idx).store(serial, std::memory_order_release);
    return true;
  }